

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

string * __thiscall
glslang::TSourceLoc::getStringNameOrNum_abi_cxx11_
          (string *__return_storage_ptr__,TSourceLoc *this,bool quoteStringName)

{
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  TString qstr;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_40;
  
  __str = this->name;
  if (__str == (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0) {
    std::__cxx11::to_string(__return_storage_ptr__,(long)this->string);
  }
  else {
    if (quoteStringName) {
      std::operator+(&local_40,"\"",__str);
      std::operator+(&bStack_68,&local_40,"\"");
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string(&bStack_68,__str);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,bStack_68._M_dataplus._M_p,
               (allocator<char> *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getStringNameOrNum(bool quoteStringName = true) const
    {
        if (name != nullptr) {
            TString qstr = quoteStringName ? ("\"" + *name + "\"") : *name;
            std::string ret_str(qstr.c_str());
            return ret_str;
        }
        return std::to_string((long long)string);
    }